

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O0

bool __thiscall crnlib::Resampler::put_line(Resampler *this,Sample *Psrc)

{
  int *piVar1;
  uchar *puVar2;
  int iVar3;
  Sample *pSVar4;
  Sample *in_RSI;
  Resampler *in_RDI;
  int i;
  int local_1c;
  bool local_1;
  
  if (in_RDI->m_cur_src_y < in_RDI->m_resample_src_y) {
    piVar1 = in_RDI->m_Psrc_y_count;
    iVar3 = resampler_range_check(in_RDI->m_cur_src_y,in_RDI->m_resample_src_y);
    if (piVar1[iVar3] == 0) {
      in_RDI->m_cur_src_y = in_RDI->m_cur_src_y + 1;
      local_1 = true;
    }
    else {
      for (local_1c = 0; (local_1c < 0x4000 && (in_RDI->m_Pscan_buf->scan_buf_y[local_1c] != -1));
          local_1c = local_1c + 1) {
      }
      if (local_1c == 0x4000) {
        in_RDI->m_status = STATUS_SCAN_BUFFER_FULL;
        local_1 = false;
      }
      else {
        puVar2 = in_RDI->m_Psrc_y_flag;
        iVar3 = resampler_range_check(in_RDI->m_cur_src_y,in_RDI->m_resample_src_y);
        puVar2[iVar3] = '\x01';
        in_RDI->m_Pscan_buf->scan_buf_y[local_1c] = in_RDI->m_cur_src_y;
        if (in_RDI->m_Pscan_buf->scan_buf_l[local_1c] == (Sample *)0x0) {
          pSVar4 = (Sample *)crnlib_malloc(0x196071);
          in_RDI->m_Pscan_buf->scan_buf_l[local_1c] = pSVar4;
          if (pSVar4 == (Sample *)0x0) {
            in_RDI->m_status = STATUS_OUT_OF_MEMORY;
            return false;
          }
        }
        if ((in_RDI->m_delay_x_resample & 1U) == 0) {
          resample_x(in_RDI,in_RDI->m_Pscan_buf->scan_buf_l[local_1c],in_RSI);
        }
        else {
          memcpy(in_RDI->m_Pscan_buf->scan_buf_l[local_1c],in_RSI,
                 (long)in_RDI->m_intermediate_x << 2);
        }
        in_RDI->m_cur_src_y = in_RDI->m_cur_src_y + 1;
        local_1 = true;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Resampler::put_line(const Sample* Psrc) {
  int i;

  if (m_cur_src_y >= m_resample_src_y)
    return false;

  /* Does this source line contribute
      * to any destination line? if not,
      * exit now.
      */

  if (!m_Psrc_y_count[resampler_range_check(m_cur_src_y, m_resample_src_y)]) {
    m_cur_src_y++;
    return true;
  }

  /* Find an empty slot in the scanline buffer. (FIXME: Perf. is terrible here with extreme scaling ratios.) */

  for (i = 0; i < MAX_SCAN_BUF_SIZE; i++)
    if (m_Pscan_buf->scan_buf_y[i] == -1)
      break;

  /* If the buffer is full, exit with an error. */

  if (i == MAX_SCAN_BUF_SIZE) {
    m_status = STATUS_SCAN_BUFFER_FULL;
    return false;
  }

  m_Psrc_y_flag[resampler_range_check(m_cur_src_y, m_resample_src_y)] = TRUE;
  m_Pscan_buf->scan_buf_y[i] = m_cur_src_y;

  /* Does this slot have any memory allocated to it? */

  if (!m_Pscan_buf->scan_buf_l[i]) {
    if ((m_Pscan_buf->scan_buf_l[i] = (Sample*)crnlib_malloc(m_intermediate_x * sizeof(Sample))) == NULL) {
      m_status = STATUS_OUT_OF_MEMORY;
      return false;
    }
  }

  // Resampling on the X axis first?
  if (m_delay_x_resample) {
    resampler_assert(m_intermediate_x == m_resample_src_x);

    // Y-X resampling order
    memcpy(m_Pscan_buf->scan_buf_l[i], Psrc, m_intermediate_x * sizeof(Sample));
  } else {
    resampler_assert(m_intermediate_x == m_resample_dst_x);

    // X-Y resampling order
    resample_x(m_Pscan_buf->scan_buf_l[i], Psrc);
  }

  m_cur_src_y++;

  return true;
}